

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caller.hpp
# Opt level: O1

PyObject * __thiscall
boost::python::detail::caller_arity<2U>::
impl<unsigned_long_(HFSubConsumer::*)(long),_boost::python::default_call_policies,_boost::mpl::vector3<unsigned_long,_DigitalConsumer_&,_long>_>
::operator()(impl<unsigned_long_(HFSubConsumer::*)(long),_boost::python::default_call_policies,_boost::mpl::vector3<unsigned_long,_DigitalConsumer_&,_long>_>
             *this,PyObject *args_,PyObject *param_2)

{
  _object *p_Var1;
  long lVar2;
  undefined8 uVar3;
  PyObject *pPVar4;
  long *plVar5;
  code *pcVar6;
  c_t1 c1;
  undefined1 local_40 [16];
  _object *local_28;
  
  lVar2 = converter::get_lvalue_from_python
                    ((_object *)args_[1].ob_type,
                     converter::detail::registered_base<DigitalConsumer_const_volatile&>::converters
                    );
  if (lVar2 != 0) {
    p_Var1 = (_object *)args_[2].ob_refcnt;
    local_40 = converter::rvalue_from_python_stage1
                         (p_Var1,converter::detail::registered_base<long_const_volatile&>::
                                 converters);
    if (local_40._0_8_ != 0) {
      pcVar6 = (code *)(this->m_data).
                       super_compressed_pair_imp<unsigned_long_(HFSubConsumer::*)(long),_boost::python::default_call_policies,_2>
                       .first_;
      plVar5 = (long *)(lVar2 + *(long *)&(this->m_data).
                                          super_compressed_pair_imp<unsigned_long_(HFSubConsumer::*)(long),_boost::python::default_call_policies,_2>
                                          .field_0x8);
      if (((ulong)pcVar6 & 1) != 0) {
        pcVar6 = *(code **)(pcVar6 + *plVar5 + -1);
      }
      local_28 = p_Var1;
      if (local_40._8_8_ != (code *)0x0) {
        (*local_40._8_8_)(p_Var1,local_40);
      }
      uVar3 = (*pcVar6)(plVar5,*(undefined8 *)local_40._0_8_);
      pPVar4 = (PyObject *)PyLong_FromUnsignedLong(uVar3);
      return pPVar4;
    }
  }
  return (PyObject *)0x0;
}

Assistant:

PyObject* operator()(PyObject* args_, PyObject*) // eliminate
                                                         // this
                                                         // trailing
                                                         // keyword dict
        {
            typedef typename mpl::begin<Sig>::type first;
            typedef typename first::type result_t;
            typedef typename select_result_converter<Policies, result_t>::type result_converter;
            typedef typename Policies::argument_package argument_package;
            
            argument_package inner_args(args_);

# if N
#  define BOOST_PP_LOCAL_MACRO(i) BOOST_PYTHON_ARG_CONVERTER(i)
#  define BOOST_PP_LOCAL_LIMITS (0, N-1)
#  include BOOST_PP_LOCAL_ITERATE()
# endif 
            // all converters have been checked. Now we can do the
            // precall part of the policy
            if (!m_data.second().precall(inner_args))
                return 0;

            PyObject* result = detail::invoke(
                detail::invoke_tag<result_t,F>()
              , create_result_converter(args_, (result_converter*)0, (result_converter*)0)
              , m_data.first()
                BOOST_PP_ENUM_TRAILING_PARAMS(N, c)
            );
            
            return m_data.second().postcall(inner_args, result);
        }